

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_message_type.cpp
# Opt level: O2

void __thiscall
BrokerMessageType_BadPartNo_Test::BrokerMessageType_BadPartNo_Test
          (BrokerMessageType_BadPartNo_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001636d0;
  return;
}

Assistant:

TEST (BrokerMessageType, BadPartNo) {
    auto create = [] () {
        std::uint32_t const mid = 3;
        std::uint16_t const part = 2;
        std::uint16_t const num_parts = 2;
        return pstore::brokerface::message_type (mid, part, num_parts, "");
    };
    check_for_error (create, ::pstore::error_code::bad_message_part_number);
}